

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeModuleImport(ExpressionContext *ctx,SynModuleImport *syntax)

{
  int iVar1;
  Lexeme *lexStream_00;
  Lexeme *lexStream;
  SynIdentifier *pSStack_88;
  uint lexStreamSize;
  SynIdentifier *pSStack_80;
  InplaceStr local_70;
  ByteCode *local_60;
  char *bytecode;
  TraceScope traceScope;
  undefined1 auStack_28 [8];
  InplaceStr moduleName;
  SynModuleImport *syntax_local;
  ExpressionContext *ctx_local;
  
  _auStack_28 = GetModuleName(ctx->allocator,ctx->moduleRoot,syntax->path);
  if (AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token == '\0') {
    iVar1 = __cxa_guard_acquire(&AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token);
    if (iVar1 != 0) {
      AnalyzeModuleImport::token = NULLC::TraceGetToken("analyze","AnalyzeModuleImport");
      __cxa_guard_release(&AnalyzeModuleImport(ExpressionContext&,SynModuleImport*)::token);
    }
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&bytecode,AnalyzeModuleImport::token);
  NULLC::TraceLabel((char *)auStack_28,moduleName.begin);
  local_60 = (ByteCode *)BinaryCache::FindBytecode((char *)auStack_28,false);
  if (local_60 == (ByteCode *)0x0) {
    pSStack_88 = (syntax->path).head;
    pSStack_80 = (syntax->path).tail;
    _auStack_28 = GetModuleName(ctx->allocator,(char *)0x0,syntax->path);
    local_70 = _auStack_28;
    local_60 = (ByteCode *)BinaryCache::FindBytecode(auStack_28,false);
  }
  lexStream._4_4_ = 0;
  lexStream_00 = BinaryCache::FindLexems((char *)auStack_28,false,(uint *)((long)&lexStream + 4));
  if (local_60 == (ByteCode *)0x0) {
    anon_unknown.dwarf_8df1c::Stop
              (ctx,&syntax->super_SynBase,"ERROR: module import is not implemented");
  }
  ImportModule(ctx,&syntax->super_SynBase,local_60,lexStream_00,lexStream._4_4_,_auStack_28);
  NULLC::TraceScope::~TraceScope((TraceScope *)&bytecode);
  return;
}

Assistant:

void AnalyzeModuleImport(ExpressionContext &ctx, SynModuleImport *syntax)
{
	InplaceStr moduleName = GetModuleName(ctx.allocator, ctx.moduleRoot, syntax->path);

	TRACE_SCOPE("analyze", "AnalyzeModuleImport");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	const char *bytecode = BinaryCache::FindBytecode(moduleName.begin, false);

	if(!bytecode)
	{
		moduleName = GetModuleName(ctx.allocator, NULL, syntax->path);

		bytecode = BinaryCache::FindBytecode(moduleName.begin, false);
	}

	unsigned lexStreamSize = 0;
	Lexeme *lexStream = BinaryCache::FindLexems(moduleName.begin, false, lexStreamSize);

	if(!bytecode)
		Stop(ctx, syntax, "ERROR: module import is not implemented");

	ImportModule(ctx, syntax, (ByteCode*)bytecode, lexStream, lexStreamSize, moduleName);
}